

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O2

int conn_recv_any(conn_handle *conn,uint8_t *buff,size_t buff_len,uint32_t *addr,uint16_t *port)

{
  void *pvVar1;
  ssize_t sVar2;
  int *piVar3;
  int iVar4;
  
  pvVar1 = conn->priv;
  *(undefined4 *)((long)pvVar1 + 0xc) = 0x80;
  mutex_lock_shared((mutex_handle *)((long)pvVar1 + 0x90));
  if (*(int *)((long)pvVar1 + 8) == -1) {
    iVar4 = -0x6b;
  }
  else {
    sVar2 = recvfrom(*(int *)((long)pvVar1 + 8),buff,buff_len & 0xffffffff,0,
                     (sockaddr *)((long)pvVar1 + 0x10),(socklen_t *)((long)pvVar1 + 0xc));
    iVar4 = (int)sVar2;
    if (iVar4 == 0) {
      iVar4 = -0x20;
    }
    else if (iVar4 == -1) {
      piVar3 = __errno_location();
      iVar4 = -*piVar3;
    }
  }
  mutex_unlock_shared((mutex_handle *)((long)pvVar1 + 0x90));
  if ((addr != (uint32_t *)0x0) && (0 < iVar4)) {
    *addr = *(uint32_t *)((long)pvVar1 + 0x14);
  }
  if ((port != (uint16_t *)0x0) && (0 < iVar4)) {
    *port = *(ushort *)((long)pvVar1 + 0x12) << 8 | *(ushort *)((long)pvVar1 + 0x12) >> 8;
  }
  return iVar4;
}

Assistant:

int conn_recv_any(struct conn_handle *conn, uint8_t *buff, size_t buff_len,
		  uint32_t *addr, uint16_t *port)
{
	struct conn_priv *priv = conn->priv;
	int ret;

	priv->remote_addr_len = sizeof(priv->remote_addr);

	mutex_lock_shared(&priv->mutex);

	if (priv->fd == INVALID_SOCKET) {
		ret = -ENOTCONN;

		goto conn_recv_any_exit;
	}

	ret = recvfrom(priv->fd, (char *)buff, (socklen_t)buff_len, 0,
		       (struct sockaddr *)&priv->remote_addr,
		       &priv->remote_addr_len);

	if (ret == 0) {
		ret = -EPIPE;
	} else if (ret == SOCKET_ERROR) {
		ret = SOCK_ERRNO;

#ifdef _WIN32
		if (ret == -WSAESHUTDOWN)
			ret = -EPIPE;

#endif
	}

conn_recv_any_exit:
	mutex_unlock_shared(&priv->mutex);

	if (addr != NULL && ret > 0)
		*addr = ((struct sockaddr_in *)&priv->remote_addr)->sin_addr.s_addr;

	if (port != NULL && ret > 0)
		*port = htons(((struct sockaddr_in *)&priv->remote_addr)->sin_port);

	return ret;
}